

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O2

glyph_t __thiscall QFontEngine::findGlyph(QFontEngine *this,QLatin1StringView name)

{
  bool bVar1;
  int iVar2;
  hb_codepoint_t hVar3;
  uint uVar4;
  hb_face_t *phVar5;
  long lVar6;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView name_local;
  hb_codepoint_t glyph;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  name_local.m_size = name.m_size;
  name_local.m_data = name.m_data;
  phVar5 = hb_qt_face_get_for_engine(this);
  lVar6 = hb_font_create(phVar5);
  if (lVar6 != 0) {
    hb_ot_font_set_funcs(lVar6);
    glyph = 0xaaaaaaaa;
    iVar2 = hb_font_get_glyph_from_name(lVar6,name.m_data,name.m_size & 0xffffffff,&glyph);
    hVar3 = glyph;
    hb_font_destroy(lVar6);
    if (hVar3 != 0 && iVar2 != 0) goto LAB_00433e9d;
  }
  s.m_data = "gid";
  s.m_size = 3;
  bVar1 = QLatin1String::startsWith(&name_local,s,CaseSensitive);
  if (bVar1) {
    name_local.m_size = name_local.m_size + -3;
    glyph = CONCAT31(glyph._1_3_,0xaa);
    name_local.m_data = name_local.m_data + 3;
    hVar3 = QLatin1String::toUInt(&name_local,(bool *)&glyph,10);
    if ((char)glyph == '\x01') {
      (*this->_vptr_QFontEngine[0x2c])(this);
    }
  }
  else {
    s_00.m_data = "uni";
    s_00.m_size = 3;
    bVar1 = QLatin1String::startsWith(&name_local,s_00,CaseSensitive);
    hVar3 = 0;
    if (bVar1) {
      name_local.m_size = name_local.m_size + -3;
      glyph = CONCAT31(glyph._1_3_,0xaa);
      name_local.m_data = name_local.m_data + 3;
      uVar4 = QLatin1String::toUInt(&name_local,(bool *)&glyph,0x10);
      if ((char)glyph == '\x01') {
        uVar4 = (*this->_vptr_QFontEngine[0xb])(this,(ulong)uVar4);
        if (uVar4 != 0) {
          (*this->_vptr_QFontEngine[0x2c])(this);
          hVar3 = uVar4;
        }
      }
    }
  }
LAB_00433e9d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return hVar3;
  }
  __stack_chk_fail();
}

Assistant:

glyph_t QFontEngine::findGlyph(QLatin1StringView name) const
{
    glyph_t result = 0;

#if QT_CONFIG(harfbuzz)
    result = queryHarfbuzz(this, [name](hb_font_t *hbFont){
        // glyph names are all ASCII, so latin1 is fine here.
        hb_codepoint_t glyph;
        if (hb_font_get_glyph_from_name(hbFont, name.constData(), name.size(), &glyph))
            return glyph_t(glyph);
        return glyph_t(0);
    });
#else // if we are here, no point in trying again if we already tried harfbuzz
    if (!result) {
        for (glyph_t index = 0; index < uint(glyphCount()); ++index) {
            if (name == glyphName(index))
                return index;
        }
    }
#endif

    if (!result) {
        constexpr auto gid = "gid"_L1;
        constexpr auto uni = "uni"_L1;
        if (name.startsWith(gid)) {
            bool ok;
            result = name.slice(gid.size()).toUInt(&ok);
            if (ok && result < glyph_t(glyphCount()))
                return result;
        } else if (name.startsWith(uni)) {
            bool ok;
            const uint ucs4 = name.slice(uni.size()).toUInt(&ok, 16);
            if (ok) {
                result = glyphIndex(ucs4);
                if (result > 0 && result < glyph_t(glyphCount()))
                    return result;
            }
        }
    }

    return result;
}